

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void dumpULong(uint64_t value,bool inArray)

{
  byte in_SIL;
  ulong in_RDI;
  uint8_t v;
  int i;
  int local_10;
  
  for (local_10 = 0x38; -1 < local_10; local_10 = local_10 + -8) {
    printf("%02hhx ",in_RDI >> ((byte)local_10 & 0x3f) & 0xff);
  }
  if ((in_SIL & 1) != 0) {
    printf(" ");
  }
  return;
}

Assistant:

void dumpULong(uint64_t value, bool inArray = false)
{
	for (int i = 56; i >= 0; i -= 8)
	{
		uint8_t v;
		v = (value >> i) & 0xff;
		printf("%02hhx ", v);
	}
	if (inArray)
	{
		printf(" ");
	}
}